

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_permissions.cpp
# Opt level: O2

bool NetWhitebindPermissions::TryParse
               (string *str,NetWhitebindPermissions *output,bilingual_str *error)

{
  long lVar1;
  bool bVar2;
  uint16_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  bool bVar4;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffea8;
  size_t offset;
  NetPermissionFlags flags;
  string local_118 [32];
  bilingual_str local_f8;
  bilingual_str local_b8;
  optional<CService> addrBind;
  string strBind;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = false;
  bVar2 = anon_unknown.dwarf_1de1c4a::TryParsePermissionFlags
                    (str,&flags,(ConnectionDirection *)0x0,&offset,error);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&strBind,str,offset,0xffffffffffffffff);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&stack0xfffffffffffffeb8,&g_dns_lookup_abi_cxx11_);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    Lookup(&addrBind,&strBind,0,false,(DNSLookupFn)in_stack_fffffffffffffea8);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffeb8);
    if (addrBind.super__Optional_base<CService,_false,_false>._M_payload.
        super__Optional_payload<CService,_true,_false,_false>.super__Optional_payload_base<CService>
        ._M_engaged == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"whitebind",(allocator<char> *)&stack0xfffffffffffffeb7);
      common::ResolveErrMsg(&local_b8,&local_f8.original,&strBind);
      bilingual_str::operator=(error,&local_b8);
      bilingual_str::~bilingual_str(&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
LAB_00593507:
      bVar4 = false;
    }
    else {
      uVar3 = CService::GetPort((CService *)&addrBind);
      if (uVar3 == 0) {
        _(&local_f8,(ConstevalStringLiteral)0x72d183);
        tinyformat::format<std::__cxx11::string>
                  (&local_b8,(tinyformat *)&local_f8,(bilingual_str *)&strBind,args);
        bilingual_str::operator=(error,&local_b8);
        bilingual_str::~bilingual_str(&local_b8);
        bilingual_str::~bilingual_str(&local_f8);
        goto LAB_00593507;
      }
      (output->super_NetPermissions).m_flags = flags;
      if (addrBind.super__Optional_base<CService,_false,_false>._M_payload.
          super__Optional_payload<CService,_true,_false,_false>.
          super__Optional_payload_base<CService>._M_engaged == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
        goto LAB_00593607;
      }
      CService::operator=(&output->m_service,(CService *)&addrBind);
      std::__cxx11::string::string<std::allocator<char>>(local_118,"",(allocator<char> *)&local_f8);
      Untranslated(&local_b8,in_stack_fffffffffffffea8);
      bilingual_str::operator=(error,&local_b8);
      bilingual_str::~bilingual_str(&local_b8);
      std::__cxx11::string::~string(local_118);
      bVar4 = true;
    }
    std::_Optional_payload_base<CService>::_M_reset((_Optional_payload_base<CService> *)&addrBind);
    std::__cxx11::string::~string((string *)&strBind);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
LAB_00593607:
  __stack_chk_fail();
}

Assistant:

bool NetWhitebindPermissions::TryParse(const std::string& str, NetWhitebindPermissions& output, bilingual_str& error)
{
    NetPermissionFlags flags;
    size_t offset;
    if (!TryParsePermissionFlags(str, flags, /*output_connection_direction=*/nullptr, offset, error)) return false;

    const std::string strBind = str.substr(offset);
    const std::optional<CService> addrBind{Lookup(strBind, 0, false)};
    if (!addrBind.has_value()) {
        error = ResolveErrMsg("whitebind", strBind);
        return false;
    }
    if (addrBind.value().GetPort() == 0) {
        error = strprintf(_("Need to specify a port with -whitebind: '%s'"), strBind);
        return false;
    }

    output.m_flags = flags;
    output.m_service = addrBind.value();
    error = Untranslated("");
    return true;
}